

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int local_24;
  int local_20;
  int columns;
  int rows;
  int puzzles;
  char **argv_local;
  int argc_local;
  
  system("clear");
  columns = 1;
  local_20 = 10;
  local_24 = 10;
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Too few arguments!\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    printHelp();
    argv_local._4_4_ = 1;
  }
  else if (argc < 7) {
    if (argc == 2) {
      columns = atoi(argv[1]);
      if ((columns < 1) || (100 < columns)) {
        printHelp();
        return 1;
      }
      std::operator<<((ostream *)&std::cout,"\nUsing default number for rows and columns: 10x10\n\n"
                     );
    }
    else {
      iVar1 = atoi(argv[2]);
      if ((iVar1 < 7) || (iVar1 = atoi(argv[2]), 0x10 < iVar1)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Number of rows is out of range!\n");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        printHelp();
        return 1;
      }
      iVar1 = atoi(argv[4]);
      if ((iVar1 < 7) || (iVar1 = atoi(argv[4]), 0x10 < iVar1)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Number of columns is out of range!\n");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        printHelp();
        return 1;
      }
      iVar1 = strcmp(argv[1],"--rows");
      if ((iVar1 != 0) || (iVar1 = strcmp(argv[3],"--cols"), iVar1 != 0)) {
        printHelp();
        return 1;
      }
      if (((argc == 6) && (iVar1 = strcmp(argv[1],"--rows"), iVar1 == 0)) &&
         (iVar1 = strcmp(argv[3],"--cols"), iVar1 == 0)) {
        columns = atoi(argv[5]);
        if ((columns < 1) || (100 < columns)) {
          printHelp();
          return 1;
        }
        local_20 = atoi(argv[2]);
        local_24 = atoi(argv[4]);
      }
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Number of puzzles: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,columns);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Number of rows: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Number of columns: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    puzzle_Generator(local_20,local_24,columns);
    argv_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Too many arguments!\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    printHelp();
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main ( int argc, char const *argv[])
{
    system("clear");

    int puzzles = NPUZZLE; //! Number of puzzles
    int rows = DFT_ROW; //! Number of rows
    int columns = DFT_COL; //! Number of columns

	//! Verifies the valid amount of arguments to the program's execution
    if( argc < 2 )
    {
        std::cout << "Too few arguments!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( argc > 6 )
    {
        std::cout << "Too many arguments!\n" << std::endl;
        printHelp();
        return EXIT_FAILURE;
    }

	/*! If the amount of arguments is equal to 2 (<executable> [number of puzzles]),
	 *  puzzles receives the value of argv[1]
	 */
    else if( argc == 2 )
    {
        puzzles = atoi(argv[1]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();
            return EXIT_FAILURE;
        }

        std::cout << "\nUsing default number for rows and columns: 10x10\n\n";
    }
	//* Verifies the interval of values allowed for rows and columns
    else if( atoi(argv[2]) < MIN_ROW or atoi(argv[2]) > MAX_ROW )
    {
        std::cout << "Number of rows is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( atoi(argv[4]) < MIN_COL or atoi(argv[4]) > MAX_COL )
    {
        std::cout << "Number of columns is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    } 
	//* Verifies if the user entered the right arguments to inform the rows and columns
    else if( strcmp( argv[1], "--rows" ) != 0 or strcmp( argv[3], "--cols" ) != 0 ) 
	{
        printHelp();

        return EXIT_FAILURE;
    }
	/*! Last verification. If everything's fine, the values of the
	 *  parameters are assigned
	 */ 
    else if( argc == 6 and ( strcmp( argv[1], "--rows" ) == 0 ) and ( strcmp( argv[3], "--cols" ) == 0 ) )
	{
        puzzles = atoi(argv[5]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();

            return EXIT_FAILURE;
        }

        rows = atoi(argv[2]);
        columns = atoi(argv[4]);
    }

    std::cout << "Number of puzzles: " << puzzles << std::endl;
    std::cout << "Number of rows: " << rows << std::endl;
    std::cout << "Number of columns: " << columns << std::endl;

    puzzle_Generator( rows, columns, puzzles );

    return EXIT_SUCCESS;
 }